

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

size_t CBB_len(CBB *cbb)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (cbb->child != (CBB *)0x0) {
    __assert_fail("cbb->child == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x11b,"size_t CBB_len(const CBB *)");
  }
  if (cbb->is_child == '\0') {
    sVar2 = (cbb->u).base.len;
  }
  else {
    uVar3 = (ulong)(cbb->u).child.pending_len_len + (cbb->u).base.len;
    uVar1 = ((cbb->u).child.base)->len;
    sVar2 = uVar1 - uVar3;
    if (uVar1 < uVar3) {
      __assert_fail("cbb->u.child.offset + cbb->u.child.pending_len_len <= cbb->u.child.base->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0x11e,"size_t CBB_len(const CBB *)");
    }
  }
  return sVar2;
}

Assistant:

size_t CBB_len(const CBB *cbb) {
  assert(cbb->child == NULL);
  if (cbb->is_child) {
    assert(cbb->u.child.offset + cbb->u.child.pending_len_len <=
           cbb->u.child.base->len);
    return cbb->u.child.base->len - cbb->u.child.offset -
           cbb->u.child.pending_len_len;
  }
  return cbb->u.base.len;
}